

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

char * duckdb::StringUtil::EnumToString
                 (EnumStringLiteral *enum_list,idx_t enum_count,char *enum_name,uint32_t enum_value)

{
  NotImplementedException *this;
  char **ppcVar1;
  string local_48;
  
  if (enum_count != 0) {
    ppcVar1 = &enum_list->string;
    do {
      if (((EnumStringLiteral *)(ppcVar1 + -1))->number == enum_value) {
        return *ppcVar1;
      }
      ppcVar1 = ppcVar1 + 2;
      enum_count = enum_count - 1;
    } while (enum_count != 0);
  }
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Enum value: unrecognized enum value \"%d\" for enum \"%s\"","");
  NotImplementedException::NotImplementedException<unsigned_int,char_const*>
            (this,&local_48,enum_value,enum_name);
  __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const char *StringUtil::EnumToString(const EnumStringLiteral enum_list[], idx_t enum_count, const char *enum_name,
                                     uint32_t enum_value) {
	for (idx_t i = 0; i < enum_count; i++) {
		if (enum_list[i].number == enum_value) {
			return enum_list[i].string;
		}
	}
	throw NotImplementedException("Enum value: unrecognized enum value \"%d\" for enum \"%s\"", enum_value, enum_name);
}